

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::~IfcRelDefinesByProperties
          (IfcRelDefinesByProperties *this)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcRelDefines + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcRelDefines).field_0x0 + lVar2);
  *(undefined8 *)(&(this->super_IfcRelDefines).field_0x0 + lVar2) = 0x836c20;
  *(undefined8 *)(&this->field_0xd8 + lVar2) = 0x836c98;
  *(undefined8 *)(&(this->super_IfcRelDefines).field_0x88 + lVar2) = 0x836c48;
  *(undefined8 *)
   ((long)&(this->super_IfcRelDefines).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper +
   lVar2) = 0x836c70;
  pvVar3 = *(void **)(&(this->super_IfcRelDefines).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.field_0x10 +
                     lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,puVar1[0x17] - (long)pvVar3);
  }
  *puVar1 = 0x836d38;
  puVar1[0x1b] = 0x836d60;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0xf0);
  return;
}

Assistant:

IfcRelDefinesByProperties() : Object("IfcRelDefinesByProperties") {}